

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::AggressiveDCEPass::KillDeadInstructions
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  long lVar1;
  BasicBlock *bp;
  IRContext *pIVar2;
  DefUseManager *this_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var3;
  char cVar4;
  bool bVar5;
  uint32_t uVar6;
  PodType id;
  Instruction *pIVar7;
  uint uVar8;
  Instruction *pIVar9;
  _List_node_base *p_Var10;
  bool modified;
  uint32_t merge_block_id;
  byte local_c5;
  uint32_t local_c4;
  undefined1 local_c0 [16];
  iterator local_b0;
  code *local_a8;
  code **local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  _Any_data local_90;
  PodType local_80;
  PodType PStack_7c;
  code **local_78;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  Instruction *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  BitVector *local_48;
  Function *local_40;
  _List_node_base *local_38;
  
  local_c5 = 0;
  p_Var10 = (structured_order->
            super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var10 == (_List_node_base *)structured_order) {
    local_c5 = 0;
  }
  else {
    local_48 = &this->live_insts_;
    local_40 = func;
    local_38 = (_List_node_base *)structured_order;
    do {
      local_c4 = 0;
      lVar1 = (long)p_Var10[1]._M_next;
      local_90._8_8_ = 0;
      local_90._M_unused._M_object = operator_new(0x18);
      *(AggressiveDCEPass **)local_90._M_unused._0_8_ = this;
      *(byte **)((long)local_90._M_unused._0_8_ + 8) = &local_c5;
      *(uint32_t **)((long)local_90._M_unused._0_8_ + 0x10) = &local_c4;
      local_78 = (code **)std::
                          _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
                          ::_M_invoke;
      _local_80 = std::
                  _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
                  ::_M_manager;
      local_c0._8_8_ = (BasicBlock *)0x0;
      local_a8 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                 ::_M_invoke;
      local_b0.node_ =
           (Instruction *)
           std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
           ::_M_manager;
      pIVar9 = *(Instruction **)(lVar1 + 8);
      local_c0._0_8_ = &local_90;
      if (pIVar9 != (Instruction *)0x0) {
        local_68 = pIVar9;
        std::
        _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:288:24)>
        ::_M_invoke(&local_90,&local_68);
      }
      pIVar9 = *(Instruction **)(lVar1 + 0x20);
      if ((pIVar9 != (Instruction *)0x0) &&
         ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        do {
          if (pIVar9 == (Instruction *)0x0) break;
          pIVar7 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          local_68 = pIVar9;
          if (local_b0.node_ == (Instruction *)0x0) {
            std::__throw_bad_function_call();
          }
          if ((pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
            pIVar7 = (Instruction *)0x0;
          }
          cVar4 = (*local_a8)((InstructionBuilder *)local_c0,&local_68);
          pIVar9 = pIVar7;
        } while (cVar4 != '\0');
      }
      if (local_b0.node_ != (Instruction *)0x0) {
        (*(code *)local_b0.node_)((InstructionBuilder *)local_c0,(InstructionBuilder *)local_c0,3);
      }
      if ((PodType  [2])_local_80 != (PodType  [2])0x0) {
        (*_local_80)(&local_90,&local_90,3);
      }
      bp = (BasicBlock *)p_Var10[1]._M_next;
      if (local_c4 == 0) {
        pIVar9 = (bp->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar9 == (Instruction *)0x0) ||
           ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
        goto LAB_0051ebed;
        bVar5 = IsLive(this,(bp->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
        if (!bVar5) {
          local_c0._0_8_ = (this->super_MemPass).super_Pass.context_;
          local_c0._8_8_ = p_Var10[1]._M_next;
          local_b0.node_ =
               &(((BasicBlock *)local_c0._8_8_)->insts_).
                super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          local_a8 = (code *)CONCAT44(local_a8._4_4_,3);
          InstructionBuilder::AddUnreachable((InstructionBuilder *)local_c0);
        }
        p_Var10 = p_Var10->_M_next;
      }
      else {
        AddBranch(this,local_c4,bp);
        do {
          p_Var10 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          pIVar9 = *(Instruction **)((long)p_Var10[1]._M_next + 8);
          uVar6 = 0;
          if (pIVar9->has_result_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
          }
        } while (uVar6 != local_c4);
        lVar1 = *(long *)((long)p_Var10[1]._M_next + 0x20);
        if ((lVar1 == 0) || (*(char *)(lVar1 + 0x18) != '\0')) {
LAB_0051ebed:
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        pIVar9 = *(Instruction **)((long)p_Var10[1]._M_next + 0x28);
        if (pIVar9->opcode_ == OpUnreachable) {
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          this_00 = (pIVar2->def_use_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                    _M_head_impl;
          _Var3._M_head_impl =
               (local_40->def_inst_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar6 = 0;
          if ((_Var3._M_head_impl)->has_type_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(_Var3._M_head_impl,0);
          }
          pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar6);
          if (pIVar7->opcode_ == OpTypeVoid) {
            pIVar9->opcode_ = OpReturn;
          }
          else {
            _Var3._M_head_impl =
                 (local_40->def_inst_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar6 = 0;
            if ((_Var3._M_head_impl)->has_type_id_ == true) {
              uVar6 = Instruction::GetSingleWordOperand(_Var3._M_head_impl,0);
            }
            id.data._M_elems =
                 (array<signed_char,_4UL>)MemPass::Type2Undef(&this->super_MemPass,uVar6);
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            pIVar7 = analysis::DefUseManager::GetDef
                               ((pIVar2->def_use_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                ._M_head_impl,(uint32_t)id.data._M_elems);
            if (pIVar7->unique_id_ == 0) goto LAB_0051ec0c;
            utils::BitVector::Set(local_48,pIVar7->unique_id_);
            pIVar9->opcode_ = OpReturnValue;
            local_90._M_unused._M_object = &PTR__SmallVector_00b02ef8;
            local_78 = (code **)&local_80;
            local_70._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
            local_80.data._M_elems = id.data._M_elems;
            local_90._8_8_ = 1;
            local_c0._0_4_ = 1;
            local_c0._8_8_ = &PTR__SmallVector_00b02ef8;
            local_b0.node_ = (Instruction *)0x0;
            local_a0 = &local_a8;
            local_98 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),
                       (SmallVector<unsigned_int,_2UL> *)&local_90);
            local_68 = (Instruction *)0x0;
            uStack_60 = 0;
            local_58 = 0;
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            _M_range_initialize<spvtools::opt::Operand_const*>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       &local_68,(InstructionBuilder *)local_c0,&local_90);
            uVar8 = (pIVar9->has_result_id_ & 1) + 1;
            if (pIVar9->has_type_id_ == false) {
              uVar8 = (uint)pIVar9->has_result_id_;
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                      (&pIVar9->operands_,
                       (Operand *)
                       ((long)((((pIVar9->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                              0xfffffffffffffffa) + (ulong)(uVar8 * 0x30)),
                       (pIVar9->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       &pIVar9->operands_,
                       (pIVar9->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_68,uStack_60);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       &local_68);
            structured_order =
                 (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
                 local_38;
            local_c0._8_8_ = &PTR__SmallVector_00b02ef8;
            if (local_98 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_98,local_98);
            }
            local_98 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_90._M_unused._M_object = &PTR__SmallVector_00b02ef8;
            if (local_70._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl !=
                (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_70,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         local_70._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl);
            }
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            analysis::DefUseManager::AnalyzeInstUse
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,pIVar9);
          }
          if (pIVar9->unique_id_ == 0) {
LAB_0051ec0c:
            __assert_fail("unique_id_ != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0xfb,"uint32_t spvtools::opt::Instruction::unique_id() const");
          }
          utils::BitVector::Set(local_48,pIVar9->unique_id_);
        }
      }
    } while (p_Var10 != (_List_node_base *)structured_order);
  }
  return (bool)(local_c5 & 1);
}

Assistant:

bool AggressiveDCEPass::KillDeadInstructions(
    const Function* func, std::list<BasicBlock*>& structured_order) {
  bool modified = false;
  for (auto bi = structured_order.begin(); bi != structured_order.end();) {
    uint32_t merge_block_id = 0;
    (*bi)->ForEachInst([this, &modified, &merge_block_id](Instruction* inst) {
      if (IsLive(inst)) return;
      if (inst->opcode() == spv::Op::OpLabel) return;
      // If dead instruction is selection merge, remember merge block
      // for new branch at end of block
      if (inst->opcode() == spv::Op::OpSelectionMerge ||
          inst->opcode() == spv::Op::OpLoopMerge)
        merge_block_id = inst->GetSingleWordInOperand(0);
      to_kill_.push_back(inst);
      modified = true;
    });
    // If a structured if or loop was deleted, add a branch to its merge
    // block, and traverse to the merge block and continue processing there.
    // We know the block still exists because the label is not deleted.
    if (merge_block_id != 0) {
      AddBranch(merge_block_id, *bi);
      for (++bi; (*bi)->id() != merge_block_id; ++bi) {
      }

      auto merge_terminator = (*bi)->terminator();
      if (merge_terminator->opcode() == spv::Op::OpUnreachable) {
        // The merge was unreachable. This is undefined behaviour so just
        // return (or return an undef). Then mark the new return as live.
        auto func_ret_type_inst = get_def_use_mgr()->GetDef(func->type_id());
        if (func_ret_type_inst->opcode() == spv::Op::OpTypeVoid) {
          merge_terminator->SetOpcode(spv::Op::OpReturn);
        } else {
          // Find an undef for the return value and make sure it gets kept by
          // the pass.
          auto undef_id = Type2Undef(func->type_id());
          auto undef = get_def_use_mgr()->GetDef(undef_id);
          live_insts_.Set(undef->unique_id());
          merge_terminator->SetOpcode(spv::Op::OpReturnValue);
          merge_terminator->SetInOperands({{SPV_OPERAND_TYPE_ID, {undef_id}}});
          get_def_use_mgr()->AnalyzeInstUse(merge_terminator);
        }
        live_insts_.Set(merge_terminator->unique_id());
      }
    } else {
      Instruction* inst = (*bi)->terminator();
      if (!IsLive(inst)) {
        // If the terminator is not live, this block has no live instructions,
        // and it will be unreachable.
        AddUnreachable(*bi);
      }
      ++bi;
    }
  }
  return modified;
}